

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_t.cpp
# Opt level: O2

void __thiscall deci::program_t::program_t(program_t *this,command_t *source,size_t sourceSize)

{
  value_t *pvVar1;
  allocator_type local_19;
  
  (this->super_function_t).super_value_t.hash = 1;
  (this->super_function_t).super_value_t._vptr_value_t = (_func_int **)&PTR_DoHashing_0011cb08;
  this->refCount = 0;
  std::vector<deci::command_t,std::allocator<deci::command_t>>::vector<deci::command_t_const*,void>
            ((vector<deci::command_t,std::allocator<deci::command_t>> *)&this->source,source,
             source + sourceSize,&local_19);
  pvVar1 = nothing_t::Instance();
  this->result = pvVar1;
  return;
}

Assistant:

program_t::program_t(const command_t* source, size_t sourceSize)
    : refCount(0)
    , source(source, source + sourceSize)
    , result(&nothing_t::Instance()) {
      ;
  }